

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

string * __thiscall
t_dart_generator::get_ttype_class_name_abi_cxx11_
          (string *__return_storage_ptr__,t_dart_generator *this,t_type *ttype)

{
  t_program *ptVar1;
  string *psVar2;
  t_program *ptVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_60;
  undefined1 local_40 [8];
  string named_import;
  t_type *ttype_local;
  t_dart_generator *this_local;
  
  ptVar3 = (this->super_t_oop_generator).super_t_generator.program_;
  named_import.field_2._8_8_ = ttype;
  ptVar1 = t_type::get_program(ttype);
  if (ptVar3 == ptVar1) {
    psVar2 = (string *)(**(code **)(*(long *)named_import.field_2._8_8_ + 0x18))();
    std::__cxx11::string::string((string *)__return_storage_ptr__,psVar2);
  }
  else {
    ptVar3 = t_type::get_program((t_type *)named_import.field_2._8_8_);
    find_library_name_abi_cxx11_(&local_60,this,ptVar3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "t_",&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::operator+(&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,"."
                  );
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (**(code **)(*(long *)named_import.field_2._8_8_ + 0x18))();
    std::operator+(__return_storage_ptr__,&local_90,__rhs);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string t_dart_generator::get_ttype_class_name(t_type* ttype) {
  if (program_ == ttype->get_program()) {
    return ttype->get_name();
  } else {
    string named_import = "t_" + find_library_name(ttype->get_program());
    return named_import + "." + ttype->get_name();
  }
}